

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::RobustnessRobustBufferAccessBehavior::ReadnPixelsTest::verifyResults(ReadnPixelsTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  GLint error;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  undefined1 local_b8 [8];
  GLubyte pixelsInvalid [63];
  uint local_6c;
  GLint bufSizeInvalid;
  GLuint i;
  GLubyte pixelsValid [64];
  GLint bufSizeValid;
  Functions *gl;
  ReadnPixelsTest *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pixelsValid[0x3c] = '@';
  pixelsValid[0x3d] = '\0';
  pixelsValid[0x3e] = '\0';
  pixelsValid[0x3f] = '\0';
  (*this->m_pReadnPixels)(0,0,8,8,0x8d94,0x1401,0x40,&bufSizeInvalid);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"ReadnPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,0x5f7);
  local_6c = 0;
  while( true ) {
    if (0x3f < local_6c) {
      (*this->m_pReadnPixels)(0,0,8,8,0x8d94,0x1401,0x3f,local_b8);
      error = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
      bVar1 = verifyError(this,error,0x502,"ReadnPixels [false positive]");
      return bVar1;
    }
    if (*(char *)((long)&bufSizeInvalid + (ulong)local_6c) != -1) break;
    local_6c = local_6c + 1;
  }
  return false;
}

Assistant:

bool ReadnPixelsTest::verifyResults()
{
	static const GLuint height = 8;
	static const GLuint width  = 8;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	//Valid buffer size test
	const GLint bufSizeValid = width * height;
	GLubyte		pixelsValid[bufSizeValid];

	m_pReadnPixels(0, 0, width, height, GL_RED_INTEGER, GL_UNSIGNED_BYTE, bufSizeValid, pixelsValid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ReadnPixels");

	//Verify glReadnPixels result
	for (GLuint i = 0; i < width * height; ++i)
	{
		if (pixelsValid[i] != 255)
			return false;
	}

	//Invalid buffer size test
	const GLint bufSizeInvalid = width * height - 1;
	GLubyte		pixelsInvalid[bufSizeInvalid];

	m_pReadnPixels(0, 0, width, height, GL_RED_INTEGER, GL_UNSIGNED_BYTE, bufSizeInvalid, pixelsInvalid);
	if (!verifyError(gl.getError(), GL_INVALID_OPERATION, "ReadnPixels [false positive]"))
		return false;

	return true;
}